

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_gears.c
# Opt level: O2

gears_t * gl_gears_init(int win_width,int win_height)

{
  int iVar1;
  ulong in_RAX;
  gears_t *gears;
  char *pcVar2;
  uchar *image_data;
  float tooth_depth;
  int texture_height;
  int texture_width;
  
  _texture_height = in_RAX;
  gears = (gears_t *)calloc(1,0x18);
  if (gears == (gears_t *)0x0) {
    puts("calloc gears failed");
  }
  else {
    glEnable(0xb71);
    glEnable(0xba1);
    glEnable(0xb50);
    glEnable(0x4000);
    pcVar2 = getenv("TEXTURE");
    image_load(pcVar2,(uchar *)0x0,&texture_width,&texture_height);
    image_data = (uchar *)malloc((long)(texture_width * texture_height * 4));
    if (image_data == (uchar *)0x0) {
      puts("malloc texture_data failed");
    }
    else {
      pcVar2 = getenv("TEXTURE");
      image_load(pcVar2,image_data,&texture_width,&texture_height);
      glTexImage2D(0xde1,0,0x1908,texture_width,_texture_height & 0xffffffff,0,0x1908,0x1401,
                   image_data);
      free(image_data);
      glTexParameteri(0xde1,0x2801,0x2601);
      glTexParameteri(0xde1,0x2800,0x2601);
      glTexEnvi(0x2300,0x2200,0x2101);
      tooth_depth = 1.0;
      glClearColor(0,0,0);
      glViewport(0,0,win_width,win_height);
      iVar1 = create_gear(gears,0,1.0,4.0,1.0,0x14,tooth_depth);
      if (((iVar1 == 0) && (iVar1 = create_gear(gears,1,0.5,2.0,2.0,10,tooth_depth), iVar1 == 0)) &&
         (iVar1 = create_gear(gears,2,1.3,2.0,0.5,10,tooth_depth), iVar1 == 0)) {
        glMatrixMode(0x1701);
        glFrustum(0xbff0000000000000,0x3ff0000000000000,-(double)win_height / (double)win_width,
                  (double)win_height / (double)win_width,0x4014000000000000,0x404e000000000000);
        glMatrixMode(0x1700);
        return gears;
      }
    }
    gl_gears_term(gears);
  }
  return (gears_t *)0x0;
}

Assistant:

static gears_t *gl_gears_init(int win_width, int win_height)
{
  gears_t *gears = NULL;
  int texture_width, texture_height;
  void *texture_data = NULL;
  const GLdouble zNear = 5, zFar = 60;

  gears = calloc(1, sizeof(gears_t));
  if (!gears) {
    printf("calloc gears failed\n");
    return NULL;
  }

  glEnable(GL_DEPTH_TEST);
  glEnable(GL_NORMALIZE);
  glEnable(GL_LIGHTING);
  glEnable(GL_LIGHT0);

  /* load texture */

  image_load(getenv("TEXTURE"), NULL, &texture_width, &texture_height);

  texture_data = malloc(texture_width * texture_height * 4);
  if (!texture_data) {
    printf("malloc texture_data failed\n");
    goto out;
  }

  image_load(getenv("TEXTURE"), texture_data, &texture_width, &texture_height);

  glTexImage2D(GL_TEXTURE_2D, 0, GL_RGBA, texture_width, texture_height, 0, GL_RGBA, GL_UNSIGNED_BYTE, texture_data);

  free(texture_data);

  glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_LINEAR);
  glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_LINEAR);
  glTexEnvi(GL_TEXTURE_ENV, GL_TEXTURE_ENV_MODE, GL_DECAL);

  /* set clear values, set viewport */

  glClearColor(0, 0, 0, 1);

  glViewport(0, 0, win_width, win_height);

  /* create gears */

  if (create_gear(gears, GEAR0, 1.0, 4.0, 1.0, 20, 0.7)) {
    goto out;
  }

  if (create_gear(gears, GEAR1, 0.5, 2.0, 2.0, 10, 0.7)) {
    goto out;
  }

  if (create_gear(gears, GEAR2, 1.3, 2.0, 0.5, 10, 0.7)) {
    goto out;
  }

  glMatrixMode(GL_PROJECTION);

  glFrustum(-1, 1, -(GLdouble)win_height/win_width, (GLdouble)win_height/win_width, zNear, zFar);

  glMatrixMode(GL_MODELVIEW);

  return gears;

out:
  gl_gears_term(gears);
  return NULL;
}